

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O3

long __thiscall
booster::locale::impl_icu::icu_std_converter<char,1>::uconv::go_abi_cxx11_(void *this)

{
  int iVar1;
  char cVar2;
  runtime_error *this_00;
  char *pcVar3;
  char in_CL;
  undefined8 *in_RSI;
  char in_R8B;
  UErrorCode err;
  allocator local_55;
  int local_54;
  string local_50;
  
  *(long *)this = (long)this + 0x10;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined1 *)((long)this + 0x10) = 0;
  std::__cxx11::string::resize((ulong)this,(in_CL + '\n') * in_R8B);
  local_54 = 0;
  cVar2 = ucnv_fromUChars_70(*in_RSI,*this,*(undefined4 *)((long)this + 8));
  iVar1 = local_54;
  if (local_54 < 1) {
    std::__cxx11::string::resize((ulong)this,cVar2);
    return (long)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  pcVar3 = (char *)u_errorName_70(iVar1);
  std::__cxx11::string::string((string *)&local_50,pcVar3,&local_55);
  runtime_error::runtime_error(this_00,&local_50);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

string_type go(UChar const *buf,int length,int max_size)
            {
                string_type res;
                res.resize(UCNV_GET_MAX_BYTES_FOR_STRING(length,max_size));
                char *ptr=reinterpret_cast<char *>(&res[0]);
                UErrorCode err=U_ZERO_ERROR;
                int n = ucnv_fromUChars(cvt_,ptr,res.size(),buf,length,&err);
                check_and_throw_icu_error(err);
                res.resize(n);
                return res;
            }